

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_remIleavedBits_const_manual_::run
          (Test_bitileave_remIleavedBits_const_manual_ *this)

{
  SourceLocation loc;
  SourceLocation loc_00;
  SourceLocation loc_01;
  SourceLocation loc_02;
  SourceLocation loc_03;
  SourceLocation loc_04;
  SourceLocation loc_05;
  SourceLocation loc_06;
  SourceLocation loc_07;
  SourceLocation loc_08;
  SourceLocation loc_09;
  bool bVar1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_c38;
  undefined1 local_c13;
  undefined1 local_c12;
  undefined1 local_c11;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  string_view local_b70;
  undefined4 local_b5c;
  uint64_t uStack_b58;
  Cmp cmp__10;
  unsigned_long *local_b50;
  uint64_t *tr__10;
  uint64_t **local_b40;
  uint64_t *tl__10;
  char *pcStack_b30;
  undefined8 local_b28;
  undefined1 local_b1b;
  undefined1 local_b1a;
  undefined1 local_b19;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_b18;
  undefined1 local_af3;
  undefined1 local_af2;
  undefined1 local_af1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  string_view local_a50;
  undefined4 local_a3c;
  uint64_t uStack_a38;
  Cmp cmp__9;
  unsigned_long *local_a30;
  uint64_t *tr__9;
  uint64_t **local_a20;
  uint64_t *tl__9;
  char *pcStack_a10;
  undefined8 local_a08;
  undefined1 local_9fb;
  undefined1 local_9fa;
  undefined1 local_9f9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_9f8;
  undefined1 local_9d3;
  undefined1 local_9d2;
  undefined1 local_9d1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  string_view local_930;
  undefined4 local_91c;
  uint64_t uStack_918;
  Cmp cmp__8;
  unsigned_long *local_910;
  uint64_t *tr__8;
  uint64_t **local_900;
  uint64_t *tl__8;
  char *pcStack_8f0;
  undefined8 local_8e8;
  undefined1 local_8db;
  undefined1 local_8da;
  undefined1 local_8d9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_8d8;
  undefined1 local_8b3;
  undefined1 local_8b2;
  undefined1 local_8b1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  string_view local_810;
  undefined4 local_7fc;
  uint64_t uStack_7f8;
  Cmp cmp__7;
  unsigned_long *local_7f0;
  uint64_t *tr__7;
  uint64_t **local_7e0;
  uint64_t *tl__7;
  char *pcStack_7d0;
  undefined8 local_7c8;
  undefined1 local_7bb;
  undefined1 local_7ba;
  undefined1 local_7b9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_7b8;
  undefined1 local_793;
  undefined1 local_792;
  undefined1 local_791;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  string_view local_6f0;
  undefined4 local_6dc;
  uint64_t uStack_6d8;
  Cmp cmp__6;
  unsigned_long *local_6d0;
  uint64_t *tr__6;
  uint64_t **local_6c0;
  uint64_t *tl__6;
  char *pcStack_6b0;
  undefined8 local_6a8;
  undefined1 local_69b;
  undefined1 local_69a;
  undefined1 local_699;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_698;
  undefined1 local_673;
  undefined1 local_672;
  undefined1 local_671;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  string_view local_5d0;
  undefined4 local_5bc;
  uint64_t uStack_5b8;
  Cmp cmp__5;
  unsigned_long *local_5b0;
  uint64_t *tr__5;
  uint64_t **local_5a0;
  uint64_t *tl__5;
  char *pcStack_590;
  undefined8 local_588;
  undefined1 local_57b;
  undefined1 local_57a;
  undefined1 local_579;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_578;
  undefined1 local_553;
  undefined1 local_552;
  undefined1 local_551;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  string_view local_4b0;
  undefined4 local_4a0;
  uint local_49c;
  Cmp cmp__4;
  uint *tr__4;
  uint **local_488;
  uint64_t *tl__4;
  char *pcStack_478;
  undefined8 local_470;
  undefined1 local_463;
  undefined1 local_462;
  undefined1 local_461;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_460;
  undefined1 local_43b;
  undefined1 local_43a;
  undefined1 local_439;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string_view local_398;
  undefined4 local_388;
  uint local_384;
  Cmp cmp__3;
  uint *tr__3;
  uint **local_370;
  uint64_t *tl__3;
  char *pcStack_360;
  undefined8 local_358;
  undefined1 local_34b;
  undefined1 local_34a;
  undefined1 local_349;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_348;
  undefined1 local_323;
  undefined1 local_322;
  undefined1 local_321;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string_view local_280;
  undefined4 local_270;
  uint local_26c;
  Cmp cmp__2;
  uint *tr__2;
  uint **local_258;
  uint64_t *tl__2;
  char *pcStack_248;
  undefined8 local_240;
  undefined1 local_233;
  undefined1 local_232;
  undefined1 local_231;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_230;
  undefined1 local_20b;
  undefined1 local_20a;
  undefined1 local_209;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string_view local_168;
  undefined4 local_158;
  uint local_154;
  Cmp cmp__1;
  uint *tr__1;
  uint **local_140;
  uint64_t *tl__1;
  char *pcStack_130;
  undefined8 local_128;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_118;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_e1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string_view local_40;
  undefined4 local_30;
  uint local_2c;
  Cmp cmp_;
  uint *tr_;
  uint **local_18;
  uint64_t *tl_;
  Test_bitileave_remIleavedBits_const_manual_ *this_local;
  
  tl_ = (uint64_t *)this;
  tr_ = (uint *)remIleavedBits_const<0u,0u>(0xff);
  local_18 = &tr_;
  local_2c = 0xff;
  _cmp_ = &local_2c;
  local_30 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_18,_cmp_);
  local_e1 = 0;
  local_f5 = 0;
  local_f6 = 0;
  local_119 = 0;
  local_11a = 0;
  local_11b = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_e0,(unsigned_long *)local_18);
    local_e1 = 1;
    std::operator+(&local_c0,
                   "Comparison failed: remIleavedBits_const<0>(0xff) == 0xffu (with \"remIleavedBits_const<0>(0xff)\"="
                   ,&local_e0);
    local_f5 = 1;
    std::operator+(&local_a0,&local_c0,", \"0xffu\"=");
    local_f6 = 1;
    stringify<unsigned_int>(&local_118,_cmp_);
    local_119 = 1;
    std::operator+(&local_80,&local_a0,&local_118);
    local_11a = 1;
    std::operator+(&local_60,&local_80,")");
    local_11b = 1;
    local_40 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
    tl__1 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_130 = "run";
    local_128 = 0x5b;
    loc.function = "run";
    loc.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc.line = 0x5b;
    assertFail(local_40,loc);
  }
  local_e1 = 0;
  local_f5 = 0;
  local_f6 = 0;
  local_119 = 0;
  local_11a = 0;
  local_11b = 0;
  tr__1 = (uint *)remIleavedBits_const<1u,0u>(0xff);
  local_140 = &tr__1;
  local_154 = 0xf;
  _cmp__1 = &local_154;
  local_158 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_140,_cmp__1);
  local_209 = 0;
  local_20a = 0;
  local_20b = 0;
  local_231 = 0;
  local_232 = 0;
  local_233 = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_208,(unsigned_long *)local_140);
    local_209 = 1;
    std::operator+(&local_1e8,
                   "Comparison failed: remIleavedBits_const<1>(0xff) == 0xfu (with \"remIleavedBits_const<1>(0xff)\"="
                   ,&local_208);
    local_20a = 1;
    std::operator+(&local_1c8,&local_1e8,", \"0xfu\"=");
    local_20b = 1;
    stringify<unsigned_int>(&local_230,_cmp__1);
    local_231 = 1;
    std::operator+(&local_1a8,&local_1c8,&local_230);
    local_232 = 1;
    std::operator+(&local_188,&local_1a8,")");
    local_233 = 1;
    local_168 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_188);
    tl__2 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_248 = "run";
    local_240 = 0x5c;
    loc_00.function = "run";
    loc_00.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_00.line = 0x5c;
    assertFail(local_168,loc_00);
  }
  local_209 = 0;
  local_20a = 0;
  local_20b = 0;
  local_231 = 0;
  local_232 = 0;
  local_233 = 0;
  tr__2 = (uint *)remIleavedBits_const<1u,0u>(0x55);
  local_258 = &tr__2;
  local_26c = 0xf;
  _cmp__2 = &local_26c;
  local_270 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_258,_cmp__2);
  local_321 = 0;
  local_322 = 0;
  local_323 = 0;
  local_349 = 0;
  local_34a = 0;
  local_34b = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_320,(unsigned_long *)local_258);
    local_321 = 1;
    std::operator+(&local_300,
                   "Comparison failed: remIleavedBits_const<1>(0b01010101) == 0b1111u (with \"remIleavedBits_const<1>(0b01010101)\"="
                   ,&local_320);
    local_322 = 1;
    std::operator+(&local_2e0,&local_300,", \"0b1111u\"=");
    local_323 = 1;
    stringify<unsigned_int>(&local_348,_cmp__2);
    local_349 = 1;
    std::operator+(&local_2c0,&local_2e0,&local_348);
    local_34a = 1;
    std::operator+(&local_2a0,&local_2c0,")");
    local_34b = 1;
    local_280 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2a0);
    tl__3 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_360 = "run";
    local_358 = 0x5d;
    loc_01.function = "run";
    loc_01.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_01.line = 0x5d;
    assertFail(local_280,loc_01);
  }
  local_321 = 0;
  local_322 = 0;
  local_323 = 0;
  local_349 = 0;
  local_34a = 0;
  local_34b = 0;
  tr__3 = (uint *)remIleavedBits_const<1u,0u>(0x5555555555555555);
  local_370 = &tr__3;
  local_384 = 0xffffffff;
  _cmp__3 = &local_384;
  local_388 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_370,_cmp__3);
  local_439 = 0;
  local_43a = 0;
  local_43b = 0;
  local_461 = 0;
  local_462 = 0;
  local_463 = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_438,(unsigned_long *)local_370);
    local_439 = 1;
    std::operator+(&local_418,
                   "Comparison failed: remIleavedBits_const<1>(0x5555\'5555\'5555\'5555) == 0xffff\'ffffu (with \"remIleavedBits_const<1>(0x5555\'5555\'5555\'5555)\"="
                   ,&local_438);
    local_43a = 1;
    std::operator+(&local_3f8,&local_418,", \"0xffff\'ffffu\"=");
    local_43b = 1;
    stringify<unsigned_int>(&local_460,_cmp__3);
    local_461 = 1;
    std::operator+(&local_3d8,&local_3f8,&local_460);
    local_462 = 1;
    std::operator+(&local_3b8,&local_3d8,")");
    local_463 = 1;
    local_398 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3b8);
    tl__4 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_478 = "run";
    local_470 = 0x5e;
    loc_02.function = "run";
    loc_02.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_02.line = 0x5e;
    assertFail(local_398,loc_02);
  }
  local_439 = 0;
  local_43a = 0;
  local_43b = 0;
  local_461 = 0;
  local_462 = 0;
  local_463 = 0;
  tr__4 = (uint *)remIleavedBits_const<3u,0u>(0x1111111111111111);
  local_488 = &tr__4;
  local_49c = 0xffff;
  _cmp__4 = &local_49c;
  local_4a0 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_488,_cmp__4);
  local_551 = 0;
  local_552 = 0;
  local_553 = 0;
  local_579 = 0;
  local_57a = 0;
  local_57b = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_550,(unsigned_long *)local_488);
    local_551 = 1;
    std::operator+(&local_530,
                   "Comparison failed: remIleavedBits_const<3>(0x1111\'1111\'1111\'1111) == 0b1111\'1111\'1111\'1111u (with \"remIleavedBits_const<3>(0x1111\'1111\'1111\'1111)\"="
                   ,&local_550);
    local_552 = 1;
    std::operator+(&local_510,&local_530,", \"0b1111\'1111\'1111\'1111u\"=");
    local_553 = 1;
    stringify<unsigned_int>(&local_578,_cmp__4);
    local_579 = 1;
    std::operator+(&local_4f0,&local_510,&local_578);
    local_57a = 1;
    std::operator+(&local_4d0,&local_4f0,")");
    local_57b = 1;
    local_4b0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4d0);
    tl__5 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_590 = "run";
    local_588 = 0x5f;
    loc_03.function = "run";
    loc_03.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_03.line = 0x5f;
    assertFail(local_4b0,loc_03);
  }
  local_551 = 0;
  local_552 = 0;
  local_553 = 0;
  local_579 = 0;
  local_57a = 0;
  local_57b = 0;
  tr__5 = (uint64_t *)remIleavedBits_const<4u,0u>(0xbc614e);
  local_5a0 = &tr__5;
  uStack_5b8 = detail::remIleavedBits_naive(0xbc614e,4);
  local_5b0 = &stack0xfffffffffffffa48;
  local_5bc = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                    ((unsigned_long *)local_5a0,local_5b0);
  local_671 = 0;
  local_672 = 0;
  local_673 = 0;
  local_699 = 0;
  local_69a = 0;
  local_69b = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_670,(unsigned_long *)local_5a0);
    local_671 = 1;
    std::operator+(&local_650,
                   "Comparison failed: remIleavedBits_const<4>(12345678) == detail::remIleavedBits_naive(12345678, 4) (with \"remIleavedBits_const<4>(12345678)\"="
                   ,&local_670);
    local_672 = 1;
    std::operator+(&local_630,&local_650,", \"detail::remIleavedBits_naive(12345678, 4)\"=");
    local_673 = 1;
    stringify<unsigned_long>(&local_698,local_5b0);
    local_699 = 1;
    std::operator+(&local_610,&local_630,&local_698);
    local_69a = 1;
    std::operator+(&local_5f0,&local_610,")");
    local_69b = 1;
    local_5d0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_5f0);
    tl__6 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_6b0 = "run";
    local_6a8 = 0x61;
    loc_04.function = "run";
    loc_04.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_04.line = 0x61;
    assertFail(local_5d0,loc_04);
  }
  local_671 = 0;
  local_672 = 0;
  local_673 = 0;
  local_699 = 0;
  local_69a = 0;
  local_69b = 0;
  tr__6 = (uint64_t *)remIleavedBits_const<8u,0u>(0xbc614e);
  local_6c0 = &tr__6;
  uStack_6d8 = detail::remIleavedBits_naive(0xbc614e,8);
  local_6d0 = &stack0xfffffffffffff928;
  local_6dc = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                    ((unsigned_long *)local_6c0,local_6d0);
  local_791 = 0;
  local_792 = 0;
  local_793 = 0;
  local_7b9 = 0;
  local_7ba = 0;
  local_7bb = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_790,(unsigned_long *)local_6c0);
    local_791 = 1;
    std::operator+(&local_770,
                   "Comparison failed: remIleavedBits_const<8>(12345678) == detail::remIleavedBits_naive(12345678, 8) (with \"remIleavedBits_const<8>(12345678)\"="
                   ,&local_790);
    local_792 = 1;
    std::operator+(&local_750,&local_770,", \"detail::remIleavedBits_naive(12345678, 8)\"=");
    local_793 = 1;
    stringify<unsigned_long>(&local_7b8,local_6d0);
    local_7b9 = 1;
    std::operator+(&local_730,&local_750,&local_7b8);
    local_7ba = 1;
    std::operator+(&local_710,&local_730,")");
    local_7bb = 1;
    local_6f0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_710);
    tl__7 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_7d0 = "run";
    local_7c8 = 0x62;
    loc_05.function = "run";
    loc_05.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_05.line = 0x62;
    assertFail(local_6f0,loc_05);
  }
  local_791 = 0;
  local_792 = 0;
  local_793 = 0;
  local_7b9 = 0;
  local_7ba = 0;
  local_7bb = 0;
  tr__7 = (uint64_t *)remIleavedBits_const<16u,0u>(0xbc614e);
  local_7e0 = &tr__7;
  uStack_7f8 = detail::remIleavedBits_naive(0xbc614e,0x10);
  local_7f0 = &stack0xfffffffffffff808;
  local_7fc = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                    ((unsigned_long *)local_7e0,local_7f0);
  local_8b1 = 0;
  local_8b2 = 0;
  local_8b3 = 0;
  local_8d9 = 0;
  local_8da = 0;
  local_8db = 0;
  if (bVar1) {
    local_8b1 = 0;
    local_8b2 = 0;
    local_8b3 = 0;
    local_8d9 = 0;
    local_8da = 0;
    local_8db = 0;
    tr__8 = (uint64_t *)remIleavedBits_const<32u,0u>(0xbc614e);
    local_900 = &tr__8;
    uStack_918 = detail::remIleavedBits_naive(0xbc614e,0x20);
    local_910 = &stack0xfffffffffffff6e8;
    local_91c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_900,local_910);
    local_9d1 = 0;
    local_9d2 = 0;
    local_9d3 = 0;
    local_9f9 = 0;
    local_9fa = 0;
    local_9fb = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_9d0,(unsigned_long *)local_900);
      local_9d1 = 1;
      std::operator+(&local_9b0,
                     "Comparison failed: remIleavedBits_const<32>(12345678) == detail::remIleavedBits_naive(12345678, 32) (with \"remIleavedBits_const<32>(12345678)\"="
                     ,&local_9d0);
      local_9d2 = 1;
      std::operator+(&local_990,&local_9b0,", \"detail::remIleavedBits_naive(12345678, 32)\"=");
      local_9d3 = 1;
      stringify<unsigned_long>(&local_9f8,local_910);
      local_9f9 = 1;
      std::operator+(&local_970,&local_990,&local_9f8);
      local_9fa = 1;
      std::operator+(&local_950,&local_970,")");
      local_9fb = 1;
      local_930 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_950);
      tl__9 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_a10 = "run";
      local_a08 = 100;
      loc_07.function = "run";
      loc_07.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_07.line = 100;
      assertFail(local_930,loc_07);
    }
    local_9d1 = 0;
    local_9d2 = 0;
    local_9d3 = 0;
    local_9f9 = 0;
    local_9fa = 0;
    local_9fb = 0;
    tr__9 = (uint64_t *)remIleavedBits_const<63u,0u>(0xbc614e);
    local_a20 = &tr__9;
    uStack_a38 = detail::remIleavedBits_naive(0xbc614e,0x3f);
    local_a30 = &stack0xfffffffffffff5c8;
    local_a3c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_a20,local_a30);
    local_af1 = 0;
    local_af2 = 0;
    local_af3 = 0;
    local_b19 = 0;
    local_b1a = 0;
    local_b1b = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_af0,(unsigned_long *)local_a20);
      local_af1 = 1;
      std::operator+(&local_ad0,
                     "Comparison failed: remIleavedBits_const<63>(12345678) == detail::remIleavedBits_naive(12345678, 63) (with \"remIleavedBits_const<63>(12345678)\"="
                     ,&local_af0);
      local_af2 = 1;
      std::operator+(&local_ab0,&local_ad0,", \"detail::remIleavedBits_naive(12345678, 63)\"=");
      local_af3 = 1;
      stringify<unsigned_long>(&local_b18,local_a30);
      local_b19 = 1;
      std::operator+(&local_a90,&local_ab0,&local_b18);
      local_b1a = 1;
      std::operator+(&local_a70,&local_a90,")");
      local_b1b = 1;
      local_a50 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a70);
      tl__10 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_b30 = "run";
      local_b28 = 0x65;
      loc_08.function = "run";
      loc_08.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_08.line = 0x65;
      assertFail(local_a50,loc_08);
    }
    local_af1 = 0;
    local_af2 = 0;
    local_af3 = 0;
    local_b19 = 0;
    local_b1a = 0;
    local_b1b = 0;
    tr__10 = (uint64_t *)remIleavedBits_const<64u,0u>(0xbc614e);
    local_b40 = &tr__10;
    uStack_b58 = detail::remIleavedBits_naive(0xbc614e,0x40);
    local_b50 = &stack0xfffffffffffff4a8;
    local_b5c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_b40,local_b50);
    local_c11 = 0;
    local_c12 = 0;
    local_c13 = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_c10,(unsigned_long *)local_b40);
      local_c11 = 1;
      std::operator+(&local_bf0,
                     "Comparison failed: remIleavedBits_const<64>(12345678) == detail::remIleavedBits_naive(12345678, 64) (with \"remIleavedBits_const<64>(12345678)\"="
                     ,&local_c10);
      local_c12 = 1;
      std::operator+(&local_bd0,&local_bf0,", \"detail::remIleavedBits_naive(12345678, 64)\"=");
      local_c13 = 1;
      stringify<unsigned_long>(&local_c38,local_b50);
      std::operator+(&local_bb0,&local_bd0,&local_c38);
      std::operator+(&local_b90,&local_bb0,")");
      local_b70 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b90);
      loc_09.function = "run";
      loc_09.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_09.line = 0x66;
      assertFail(local_b70,loc_09);
    }
    return;
  }
  stringify<unsigned_long>(&local_8b0,(unsigned_long *)local_7e0);
  local_8b1 = 1;
  std::operator+(&local_890,
                 "Comparison failed: remIleavedBits_const<16>(12345678) == detail::remIleavedBits_naive(12345678, 16) (with \"remIleavedBits_const<16>(12345678)\"="
                 ,&local_8b0);
  local_8b2 = 1;
  std::operator+(&local_870,&local_890,", \"detail::remIleavedBits_naive(12345678, 16)\"=");
  local_8b3 = 1;
  stringify<unsigned_long>(&local_8d8,local_7f0);
  local_8d9 = 1;
  std::operator+(&local_850,&local_870,&local_8d8);
  local_8da = 1;
  std::operator+(&local_830,&local_850,")");
  local_8db = 1;
  local_810 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_830);
  tl__8 = (uint64_t *)anon_var_dwarf_a493;
  pcStack_8f0 = "run";
  local_8e8 = 99;
  loc_06.function = "run";
  loc_06.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc_06.line = 99;
  assertFail(local_810,loc_06);
}

Assistant:

BITMANIP_TEST(bitileave, remIleavedBits_const_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<0>(0xff), 0xffu);
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<1>(0xff), 0xfu);
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<1>(0b01010101), 0b1111u);
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<1>(0x5555'5555'5555'5555), 0xffff'ffffu);
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<3>(0x1111'1111'1111'1111), 0b1111'1111'1111'1111u);

    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<4>(12345678), detail::remIleavedBits_naive(12345678, 4));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<8>(12345678), detail::remIleavedBits_naive(12345678, 8));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<16>(12345678), detail::remIleavedBits_naive(12345678, 16));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<32>(12345678), detail::remIleavedBits_naive(12345678, 32));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<63>(12345678), detail::remIleavedBits_naive(12345678, 63));
    BITMANIP_STATIC_ASSERT_EQ(remIleavedBits_const<64>(12345678), detail::remIleavedBits_naive(12345678, 64));
}